

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecryptionHelper.cpp
# Opt level: O2

void __thiscall DecryptionHelper::DecryptionHelper(DecryptionHelper *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_DecryptionHelper = (_func_int **)&PTR__DecryptionHelper_00371110;
  p_Var1 = &(this->mXcrypts)._M_t._M_impl.super__Rb_tree_header;
  (this->mXcrypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mXcrypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mXcrypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mXcrypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mXcrypts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mO).super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mO;
  (this->mO).super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mO;
  (this->mO).super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node._M_size
       = 0;
  (this->mU).super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mU;
  (this->mU).super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mU;
  (this->mU).super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node._M_size
       = 0;
  (this->mFileIDPart1).super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->mFileIDPart1;
  (this->mFileIDPart1).super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->mFileIDPart1;
  (this->mFileIDPart1).super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  _M_node._M_size = 0;
  Reset(this);
  return;
}

Assistant:

DecryptionHelper::DecryptionHelper(void)
{
	Reset();
}